

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O0

XrResult xrNegotiateLoaderApiLayerInterface
                   (XrNegotiateLoaderInfo *loaderInfo,char *layerName,
                   XrNegotiateApiLayerRequest *layerRequest)

{
  XrNegotiateApiLayerRequest *layerRequest_local;
  char *layerName_local;
  XrNegotiateLoaderInfo *loaderInfo_local;
  
  if (((((loaderInfo == (XrNegotiateLoaderInfo *)0x0) ||
        (layerRequest == (XrNegotiateApiLayerRequest *)0x0)) ||
       (loaderInfo->structType != XR_LOADER_INTERFACE_STRUCT_LOADER_INFO)) ||
      ((((loaderInfo->structVersion != 1 || (loaderInfo->structSize != 0x28)) ||
        ((layerRequest->structType != XR_LOADER_INTERFACE_STRUCT_API_LAYER_REQUEST ||
         ((layerRequest->structVersion != 1 || (layerRequest->structSize != 0x30)))))) ||
       (1 < loaderInfo->minInterfaceVersion)))) ||
     (((loaderInfo->maxInterfaceVersion == 0 || (loaderInfo->minApiVersion < 0x100000000)) ||
      (0x10000ffffffff < loaderInfo->minApiVersion)))) {
    loaderInfo_local._4_4_ = XR_ERROR_INITIALIZATION_FAILED;
  }
  else {
    layerRequest->layerInterfaceVersion = 1;
    layerRequest->layerApiVersion = 0x100000000;
    layerRequest->getInstanceProcAddr = LayerTestXrGetInstanceProcAddr;
    layerRequest->createApiLayerInstance = LayerTestXrCreateApiLayerInstance;
    loaderInfo_local._4_4_ = XR_SUCCESS;
  }
  return loaderInfo_local._4_4_;
}

Assistant:

LAYER_EXPORT XRAPI_ATTR XrResult XRAPI_CALL xrNegotiateLoaderApiLayerInterface(const XrNegotiateLoaderInfo *loaderInfo,
                                                                               const char *layerName,
                                                                               XrNegotiateApiLayerRequest *layerRequest) {
    if (nullptr == loaderInfo || nullptr == layerRequest || loaderInfo->structType != XR_LOADER_INTERFACE_STRUCT_LOADER_INFO ||
        loaderInfo->structVersion != XR_LOADER_INFO_STRUCT_VERSION || loaderInfo->structSize != sizeof(XrNegotiateLoaderInfo) ||
        layerRequest->structType != XR_LOADER_INTERFACE_STRUCT_API_LAYER_REQUEST ||
        layerRequest->structVersion != XR_API_LAYER_INFO_STRUCT_VERSION ||
        layerRequest->structSize != sizeof(XrNegotiateApiLayerRequest) ||
        loaderInfo->minInterfaceVersion > XR_CURRENT_LOADER_API_LAYER_VERSION ||
        loaderInfo->maxInterfaceVersion < XR_CURRENT_LOADER_API_LAYER_VERSION ||
        loaderInfo->minApiVersion < XR_MAKE_VERSION(0, 1, 0) || loaderInfo->minApiVersion >= XR_MAKE_VERSION(1, 1, 0)) {
        return XR_ERROR_INITIALIZATION_FAILED;
    }

    (void)layerName;
    layerRequest->layerInterfaceVersion = XR_CURRENT_LOADER_API_LAYER_VERSION;
    layerRequest->layerApiVersion = XR_MAKE_VERSION(0, 1, 0);
    layerRequest->getInstanceProcAddr = LayerTestXrGetInstanceProcAddr;
    layerRequest->createApiLayerInstance = LayerTestXrCreateApiLayerInstance;

    return XR_SUCCESS;
}